

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo.c
# Opt level: O2

int run_loop(int fd,quicly_conn_t *client)

{
  unsigned_long *packet;
  quicly_conn_t *pqVar1;
  uint __i;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  int64_t iVar5;
  int64_t iVar6;
  int *piVar7;
  ulong datagram_size;
  quicly_stream_t *stream;
  ssize_t sVar8;
  int64_t delta;
  long lVar9;
  long lVar10;
  size_t sVar11;
  uint8_t *puVar12;
  uint8_t *puVar13;
  uint8_t *puVar14;
  uint8_t *puVar15;
  uint8_t *puVar16;
  uint8_t *puVar17;
  quicly_conn_t **ppqVar18;
  uint8_t *puVar19;
  bool bVar20;
  undefined8 uStackY_1a60;
  undefined1 local_1a48 [8];
  uint8_t buf [4096];
  quicly_conn_t *conns [256];
  sockaddr_storage sa;
  quicly_decoded_packet_t decoded;
  fd_set readfds;
  quicly_address_t src;
  timeval local_88;
  quicly_conn_t **local_78;
  long local_70;
  size_t local_68;
  size_t off;
  iovec vec;
  
  memset(buf + 0xff8,0,0x800);
  bVar20 = client != (quicly_conn_t *)0x0;
  vec.iov_len = (size_t)(fd / 0x40);
  uVar4 = 1L << ((byte)fd & 0x3f);
  packet = &sa.__ss_align;
  buf._4088_8_ = client;
LAB_001137ac:
  do {
    iVar5 = (*(ctx.now)->cb)(ctx.now);
    lVar9 = 0x7fffffffffffffff;
    for (puVar19 = buf + 0xff8; *(quicly_conn_t **)puVar19 != (quicly_conn_t *)0x0;
        puVar19 = puVar19 + 8) {
      iVar6 = quicly_get_first_timeout(*(quicly_conn_t **)puVar19);
      if (iVar6 < lVar9) {
        lVar9 = iVar6;
      }
    }
    lVar10 = lVar9 - iVar5;
    if (lVar10 == 0 || lVar9 < iVar5) {
      local_88.tv_sec = 1000;
      local_88.tv_usec = 0;
    }
    else {
      if (999999 < lVar10) {
        lVar10 = 1000000;
      }
      local_88.tv_sec = lVar10 / 1000;
      local_88.tv_usec = (lVar10 % 1000) * 1000;
    }
    for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 1) {
      readfds.fds_bits[lVar9 + -1] = 0;
    }
    readfds.fds_bits[vec.iov_len - 1] = readfds.fds_bits[vec.iov_len - 1] | uVar4;
    if (bVar20) {
      decoded._is_stateless_reset_cached._0_1_ =
           (undefined1)decoded._is_stateless_reset_cached |
           QUICLY__DECODED_PACKET_CACHED_IS_STATELESS_RESET;
    }
    iVar2 = select(fd + 1,(fd_set *)&decoded._is_stateless_reset_cached,(fd_set *)0x0,(fd_set *)0x0,
                   &local_88);
  } while ((iVar2 == -1) && (piVar7 = __errno_location(), *piVar7 == 4));
  if ((readfds.fds_bits[vec.iov_len - 1] & uVar4) != 0) {
    off = (size_t)local_1a48;
    vec.iov_base = (void *)0x1000;
    readfds.fds_bits[0xf] = (__fd_mask)(conns + 0xff);
    do {
      datagram_size = recvmsg(fd,(msghdr *)(readfds.fds_bits + 0xf),0);
      if (datagram_size != 0xffffffffffffffff) {
        if (0 < (long)datagram_size) {
          local_68 = 0;
          goto LAB_0011391d;
        }
        break;
      }
      piVar7 = __errno_location();
    } while (*piVar7 == 4);
  }
  goto LAB_001139c7;
LAB_0011391d:
  do {
    sVar11 = quicly_decode_packet
                       (&ctx,(quicly_decoded_packet_t *)packet,(uint8_t *)off,datagram_size,
                        &local_68);
    if (sVar11 == 0xffffffffffffffff) break;
    for (ppqVar18 = (quicly_conn_t **)(buf + 0xff8); *ppqVar18 != (quicly_conn_t *)0x0;
        ppqVar18 = ppqVar18 + 1) {
      iVar2 = quicly_is_destination
                        (*ppqVar18,(sockaddr *)0x0,(sockaddr *)readfds.fds_bits[0xf],
                         (quicly_decoded_packet_t *)packet);
      if (iVar2 != 0) {
        if (*ppqVar18 != (quicly_conn_t *)0x0) {
          quicly_receive(*ppqVar18,(sockaddr *)0x0,(sockaddr *)readfds.fds_bits[0xf],
                         (quicly_decoded_packet_t *)packet);
          goto LAB_001139bd;
        }
        break;
      }
    }
    if (client == (quicly_conn_t *)0x0) {
      uStackY_1a60 = 0x1139bb;
      quicly_accept(ppqVar18,&ctx,(sockaddr *)0x0,(sockaddr *)readfds.fds_bits[0xf],
                    (quicly_decoded_packet_t *)packet,(quicly_address_token_plaintext_t *)0x0,
                    &next_cid,(ptls_handshake_properties_t *)0x0);
    }
LAB_001139bd:
  } while (local_68 < datagram_size);
LAB_001139c7:
  if (((undefined1)decoded._is_stateless_reset_cached &
      QUICLY__DECODED_PACKET_CACHED_IS_STATELESS_RESET) !=
      QUICLY__DECODED_PACKET_CACHED_MAYBE_STATELESS_RESET) {
    if (client == (quicly_conn_t *)0x0) {
      __assert_fail("client != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/examples/echo.c"
                    ,0xf3,"int run_loop(int, quicly_conn_t *)");
    }
    stream = quicly_get_stream(client,0);
    if ((stream == (quicly_stream_t *)0x0) || ((stream->sendstate).final_size != 0xffffffffffffffff)
       ) {
LAB_001139f6:
      bVar20 = false;
    }
    else {
      do {
        sVar11 = read(0,local_1a48,0x1000);
        if (sVar11 != 0xffffffffffffffff) {
          if (sVar11 == 0) {
            quicly_streambuf_egress_shutdown(stream);
            goto LAB_001139f6;
          }
          break;
        }
        piVar7 = __errno_location();
      } while (*piVar7 == 4);
      quicly_streambuf_egress_write(stream,local_1a48,sVar11);
    }
  }
  lVar9 = 0;
  do {
    ppqVar18 = conns + lVar9 + -1;
    local_78 = conns + lVar9;
    local_70 = lVar9;
    while( true ) {
      if (*ppqVar18 == (quicly_conn_t *)0x0) goto LAB_001137ac;
      lVar10 = -(ctx.transport_params.max_udp_payload_size * 10 + 0xf & 0xfffffffffffffff0);
      off = 10;
      pqVar1 = *ppqVar18;
      *(uint64_t *)(buf + lVar10 + -0x18) = ctx.transport_params.max_udp_payload_size * 10;
      *(undefined8 *)((long)&uStackY_1a60 + lVar10) = 0x113a7f;
      uVar3 = quicly_send(pqVar1,(quicly_address_t *)(conns + 0xff),
                          (quicly_address_t *)(readfds.fds_bits + 0xf),(iovec *)local_1a48,&off,
                          local_1a48 + lVar10,*(size_t *)(buf + lVar10 + -0x18));
      if (uVar3 != 0xff03) break;
      pqVar1 = *ppqVar18;
      puVar12 = buf + lVar10 + -0x10;
      puVar12[0] = 0x92;
      puVar12[1] = ':';
      puVar12[2] = '\x11';
      puVar12[3] = '\0';
      puVar12[4] = '\0';
      puVar12[5] = '\0';
      puVar12[6] = '\0';
      puVar12[7] = '\0';
      quicly_free(pqVar1);
      puVar13 = buf + lVar10 + -0x10;
      puVar13[0] = 0xa1;
      puVar13[1] = ':';
      puVar13[2] = '\x11';
      puVar13[3] = '\0';
      puVar13[4] = '\0';
      puVar13[5] = '\0';
      puVar13[6] = '\0';
      puVar13[7] = '\0';
      memmove(ppqVar18,local_78,lVar9 * -8 + 0x7f8);
      if (((ctx.tls)->certificates).count == 0) {
        return 0;
      }
    }
    if (uVar3 != 0) {
      puVar17 = buf + lVar10 + -0x10;
      puVar17[0] = 0xc5;
      puVar17[1] = ';';
      puVar17[2] = '\x11';
      puVar17[3] = '\0';
      puVar17[4] = '\0';
      puVar17[5] = '\0';
      puVar17[6] = '\0';
      puVar17[7] = '\0';
      fprintf(_stderr,"quicly_send returned %d\n",(ulong)uVar3);
      return 1;
    }
    for (sVar11 = 0; sVar11 != off; sVar11 = sVar11 + 1) {
      sa.__ss_align = (unsigned_long)(conns + 0xff);
      puVar14 = buf + lVar10 + -0x10;
      puVar14[0] = 0xf0;
      puVar14[1] = ':';
      puVar14[2] = '\x11';
      puVar14[3] = '\0';
      puVar14[4] = '\0';
      puVar14[5] = '\0';
      puVar14[6] = '\0';
      puVar14[7] = '\0';
      decoded.octets.base._0_4_ = quicly_get_socklen((sockaddr *)sa.__ss_align);
      decoded.cid.dest.encrypted.base = (uint8_t *)0x1;
      decoded.cid.dest.encrypted.len = 0;
      decoded.cid.dest.plaintext.master_id = 0;
      decoded.cid.dest.plaintext._4_4_ = 0;
      decoded.cid.dest.plaintext.node_id._0_4_ = 0;
      decoded.octets.len = (size_t)(local_1a48 + sVar11 * 0x10);
      do {
        puVar15 = buf + lVar10 + -0x10;
        builtin_memcpy(buf + lVar10 + -0x10,"&;\x11",4);
        puVar15[4] = '\0';
        puVar15[5] = '\0';
        puVar15[6] = '\0';
        puVar15[7] = '\0';
        sVar8 = sendmsg(fd,(msghdr *)packet,0);
        if ((int)sVar8 != -1) break;
        puVar16 = buf + lVar10 + -0x10;
        builtin_memcpy(buf + lVar10 + -0x10,"0;\x11",4);
        puVar16[4] = '\0';
        puVar16[5] = '\0';
        puVar16[6] = '\0';
        puVar16[7] = '\0';
        piVar7 = __errno_location();
      } while (*piVar7 == 4);
    }
    lVar9 = local_70 + 1;
  } while( true );
}

Assistant:

static int run_loop(int fd, quicly_conn_t *client)
{
    quicly_conn_t *conns[256] = {client}; /* a null-terminated list of connections; proper app should use a hashmap or something */
    size_t i;
    int read_stdin = client != NULL;

    while (1) {

        /* wait for sockets to become readable, or some event in the QUIC stack to fire */
        fd_set readfds;
        struct timeval tv;
        do {
            int64_t first_timeout = INT64_MAX, now = ctx.now->cb(ctx.now);
            for (i = 0; conns[i] != NULL; ++i) {
                int64_t conn_timeout = quicly_get_first_timeout(conns[i]);
                if (conn_timeout < first_timeout)
                    first_timeout = conn_timeout;
            }
            if (now < first_timeout) {
                int64_t delta = first_timeout - now;
                if (delta > 1000 * 1000)
                    delta = 1000 * 1000;
                tv.tv_sec = delta / 1000;
                tv.tv_usec = (delta % 1000) * 1000;
            } else {
                tv.tv_sec = 1000;
                tv.tv_usec = 0;
            }
            FD_ZERO(&readfds);
            FD_SET(fd, &readfds);
            /* we want to read input from stdin */
            if (read_stdin)
                FD_SET(0, &readfds);
        } while (select(fd + 1, &readfds, NULL, NULL, &tv) == -1 && errno == EINTR);

        /* read the QUIC fd */
        if (FD_ISSET(fd, &readfds)) {
            uint8_t buf[4096];
            struct sockaddr_storage sa;
            struct iovec vec = {.iov_base = buf, .iov_len = sizeof(buf)};
            struct msghdr msg = {.msg_name = &sa, .msg_namelen = sizeof(sa), .msg_iov = &vec, .msg_iovlen = 1};
            ssize_t rret;
            while ((rret = recvmsg(fd, &msg, 0)) == -1 && errno == EINTR)
                ;
            if (rret > 0)
                process_msg(client != NULL, conns, &msg, rret);
        }

        /* read stdin, send the input to the active stram */
        if (FD_ISSET(0, &readfds)) {
            assert(client != NULL);
            if (!forward_stdin(client))
                read_stdin = 0;
        }

        /* send QUIC packets, if any */
        for (i = 0; conns[i] != NULL; ++i) {
            quicly_address_t dest, src;
            struct iovec dgrams[10];
            uint8_t dgrams_buf[PTLS_ELEMENTSOF(dgrams) * ctx.transport_params.max_udp_payload_size];
            size_t num_dgrams = PTLS_ELEMENTSOF(dgrams);
            int ret = quicly_send(conns[i], &dest, &src, dgrams, &num_dgrams, dgrams_buf, sizeof(dgrams_buf));
            switch (ret) {
            case 0: {
                size_t j;
                for (j = 0; j != num_dgrams; ++j) {
                    send_one(fd, &dest.sa, &dgrams[j]);
                }
            } break;
            case QUICLY_ERROR_FREE_CONNECTION:
                /* connection has been closed, free, and exit when running as a client */
                quicly_free(conns[i]);
                memmove(conns + i, conns + i + 1, sizeof(conns) - sizeof(conns[0]) * (i + 1));
                --i;
                if (!is_server())
                    return 0;
                break;
            default:
                fprintf(stderr, "quicly_send returned %d\n", ret);
                return 1;
            }
        }
    }

    return 0;
}